

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O2

void __thiscall btBox2dShape::getPlaneEquation(btBox2dShape *this,btVector4 *plane,int i)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  undefined8 uVar4;
  
  if (5 < (uint)i) {
    return;
  }
  bVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  bVar3 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[1];
  bVar2 = 0.0;
  switch(i) {
  case 0:
    uVar4 = 0x3f800000;
    bVar3 = bVar1;
    break;
  case 1:
    uVar4 = 0xbf800000;
    bVar3 = bVar1;
    break;
  case 2:
    uVar4 = 0x3f80000000000000;
    break;
  case 3:
    uVar4 = 0xbf80000000000000;
    break;
  case 4:
    bVar2 = 1.0;
    goto LAB_0014c67c;
  case 5:
    bVar2 = -1.0;
LAB_0014c67c:
    uVar4 = 0;
    bVar3 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
            m_implicitShapeDimensions.m_floats[2];
  }
  *(undefined8 *)(plane->super_btVector3).m_floats = uVar4;
  (plane->super_btVector3).m_floats[2] = bVar2;
  (plane->super_btVector3).m_floats[3] = -bVar3;
  return;
}

Assistant:

virtual void	getPlaneEquation(btVector4& plane,int i) const
	{
		btVector3 halfExtents = getHalfExtentsWithoutMargin();

		switch (i)
		{
		case 0:
			plane.setValue(btScalar(1.),btScalar(0.),btScalar(0.),-halfExtents.x());
			break;
		case 1:
			plane.setValue(btScalar(-1.),btScalar(0.),btScalar(0.),-halfExtents.x());
			break;
		case 2:
			plane.setValue(btScalar(0.),btScalar(1.),btScalar(0.),-halfExtents.y());
			break;
		case 3:
			plane.setValue(btScalar(0.),btScalar(-1.),btScalar(0.),-halfExtents.y());
			break;
		case 4:
			plane.setValue(btScalar(0.),btScalar(0.),btScalar(1.),-halfExtents.z());
			break;
		case 5:
			plane.setValue(btScalar(0.),btScalar(0.),btScalar(-1.),-halfExtents.z());
			break;
		default:
			btAssert(0);
		}
	}